

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

int __thiscall
kj::anon_unknown_31::WebSocketPipeImpl::BlockedReceive::close(BlockedReceive *this,int __fd)

{
  undefined8 *puVar1;
  StringPtr *in_RDX;
  undefined4 in_register_00000034;
  long lVar2;
  Fault f;
  kj local_80 [16];
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> local_70;
  Close local_48;
  
  lVar2 = CONCAT44(in_register_00000034,__fd);
  if (*(long *)(lVar2 + 0x18) == 0) {
    puVar1 = *(undefined8 **)(lVar2 + 8);
    local_48.code = (uint16_t)in_RDX;
    str<kj::StringPtr&>(&local_48.reason,local_80,in_RDX);
    OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::OneOf<kj::WebSocket::Close>
              (&local_70,&local_48);
    (**(code **)*puVar1)(puVar1,&local_70);
    OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::~OneOf(&local_70);
    Array<char>::~Array(&local_48.reason.content);
    if (*(long *)(*(long *)(lVar2 + 0x10) + 0x18) == lVar2) {
      *(undefined8 *)(*(long *)(lVar2 + 0x10) + 0x18) = 0;
    }
    Promise<void>::Promise((Promise<void> *)this);
    return (int)this;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16]>
            ((Fault *)&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
             ,0xb48,FAILED,"canceler.isEmpty()","\"already pumping\"",
             (char (*) [16])"already pumping");
  _::Debug::Fault::fatal((Fault *)&local_70);
}

Assistant:

kj::Promise<void> close(uint16_t code, kj::StringPtr reason) override {
      KJ_REQUIRE(canceler.isEmpty(), "already pumping");
      fulfiller.fulfill(Message(Close { code, kj::str(reason) }));
      pipe.endState(*this);
      return kj::READY_NOW;
    }